

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall
pbrt::BasicSceneBuilder::CoordinateSystem(BasicSceneBuilder *this,string *origName,FileLoc loc)

{
  mapped_type *__dest;
  string *in_RSI;
  long in_RDI;
  string *in_stack_00000008;
  string name;
  string local_50 [8];
  key_type *in_stack_ffffffffffffffb8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet>_>_>
  *in_stack_ffffffffffffffc0;
  string local_30 [48];
  
  std::__cxx11::string::string(local_50,in_RSI);
  NormalizeUTF8(in_stack_00000008);
  std::__cxx11::string::~string(local_50);
  __dest = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet>_>_>
           ::operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  memcpy(__dest,(void *)(in_RDI + 800),0x100);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void BasicSceneBuilder::CoordinateSystem(const std::string &origName, FileLoc loc) {
    std::string name = NormalizeUTF8(origName);
    namedCoordinateSystems[name] = graphicsState.ctm;
}